

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_CBZ(DisasContext_conflict1 *s,arg_CBZ *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i32 arg1;
  TCGCond cond;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_CBZ *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  arg1 = load_reg(s,a->rn);
  arm_gen_condlabel(s);
  cond = TCG_COND_NE;
  if (a->nz != 0) {
    cond = TCG_COND_EQ;
  }
  tcg_gen_brcondi_i32_aarch64(tcg_ctx_00,cond,arg1,0,s->condlabel);
  tcg_temp_free_i32(tcg_ctx_00,arg1);
  uVar1 = read_pc(s);
  gen_jmp(s,uVar1 + a->imm);
  return true;
}

Assistant:

static bool trans_CBZ(DisasContext *s, arg_CBZ *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp = load_reg(s, a->rn);

    arm_gen_condlabel(s);
    tcg_gen_brcondi_i32(tcg_ctx, a->nz ? TCG_COND_EQ : TCG_COND_NE,
                        tmp, 0, s->condlabel);
    tcg_temp_free_i32(tcg_ctx, tmp);
    gen_jmp(s, read_pc(s) + a->imm);
    return true;
}